

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O3

void __thiscall glslang::TStringAtomMap::addAtomFixed(TStringAtomMap *this,char *s,int atom)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_false,_true>,_bool>
  *ppVar1;
  pointer ppbVar2;
  pool_allocator<char> local_58;
  value_type local_50 [5];
  int local_28;
  
  local_58.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_50,s,
             &local_58);
  local_28 = atom;
  ppVar1 = std::
           _Hashtable<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,int>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::hash<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,int>>
                     (this,(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)local_50);
  ppbVar2 = (this->stringMap).
            super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
            .
            super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->stringMap).
                    super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                    .
                    super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppbVar2 >> 3) <
      (long)atom + 1U) {
    local_50[0] = &this->badToken;
    std::
    vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
    ::resize(&(this->stringMap).
              super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
             ,(long)(atom + 100),local_50);
    ppbVar2 = (this->stringMap).
              super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
              .
              super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  ppbVar2[atom] =
       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&ppVar1->second
  ;
  return;
}

Assistant:

void addAtomFixed(const char* s, int atom)
    {
        auto it = atomMap.insert(std::pair<TString, int>(s, atom)).first;
        if (stringMap.size() < (size_t)atom + 1)
            stringMap.resize(atom + 100, &badToken);
        stringMap[atom] = &it->first;
    }